

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_void>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
* __thiscall
phmap::priv::
node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_void>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
::operator=(node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_void>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
            *this,node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::NonMovableKey,_int>,_void>,_std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
                  *other)

{
  destroy(this);
  if ((other->alloc_).
      super__Optional_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
      ._M_engaged == true) {
    (this->alloc_).
    super__Optional_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
    ._M_engaged = true;
    if ((other->alloc_).
        super__Optional_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
        ._M_engaged == false) {
      __assert_fail("!empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                    ,0xb09,
                    "slot_type *phmap::priv::node_handle_base<phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>>, std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>>::slot() const [PolicyTraits = phmap::priv::hash_policy_traits<phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous namespace)::NonMovableKey, int>>, Alloc = std::allocator<std::pair<const phmap::priv::(anonymous namespace)::NonMovableKey, int>>]"
                   );
    }
    *(undefined8 *)(this->slot_space_).data = *(undefined8 *)(other->slot_space_).data;
    (other->alloc_).
    super__Optional_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::allocator<std::pair<const_phmap::priv::(anonymous_namespace)::NonMovableKey,_int>_>_>
    ._M_engaged = false;
  }
  return this;
}

Assistant:

node_handle_base& operator=(node_handle_base&& other) noexcept {
        destroy();
        if (!other.empty()) {
            if (other.alloc_) {
               alloc_.emplace(other.alloc_.value());
            }
            PolicyTraits::transfer(alloc(), slot(), other.slot());
            other.reset();
        }
        return *this;
    }